

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QJsonArray __thiscall QVariant::toJsonArray(QVariant *this)

{
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QJsonArray>(in_stack_00000028);
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QJsonArray QVariant::toJsonArray() const
{
    return qvariant_cast<QJsonArray>(*this);
}